

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::char_spec_handler::on_char(char_spec_handler *this)

{
  char cVar1;
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  *paVar2;
  buffer<char> *pbVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  size_t sVar5;
  ulong uVar6;
  
  paVar2 = this->formatter;
  if (paVar2->specs_ == (basic_format_specs<char> *)0x0) {
    cVar1 = this->value;
    pbVar3 = (paVar2->out_).container;
    sVar5 = pbVar3->size_;
    uVar6 = sVar5 + 1;
    if (pbVar3->capacity_ < uVar6) {
      (**pbVar3->_vptr_buffer)(pbVar3);
      sVar5 = pbVar3->size_;
      uVar6 = sVar5 + 1;
    }
    pbVar3->size_ = uVar6;
    pbVar3->ptr_[sVar5] = cVar1;
  }
  else {
    bVar4 = write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      ((paVar2->out_).container,this->value,paVar2->specs_);
    (this->formatter->out_).container = bVar4.container;
  }
  return;
}

Assistant:

void on_char() {
      if (formatter.specs_)
        formatter.out_ = write_char(formatter.out_, value, *formatter.specs_);
      else
        formatter.write(value);
    }